

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_27::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  ostream *poVar1;
  char *_escapeCode_local;
  PosixColourImpl *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,'\x1b');
  std::operator<<(poVar1,_escapeCode);
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            std::cout << '\033' << _escapeCode;
        }